

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::to_string
          (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  proxy *in_RDI;
  list *in_stack_000000a8;
  
  to_string<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>(in_stack_000000a8);
  return (string)in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}